

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O2

int setup_listening_socket(int port)

{
  int __fd;
  int iVar1;
  char *__s;
  int enable;
  sockaddr local_20;
  
  __fd = socket(2,1,0);
  if (__fd == -1) {
    __s = "socket()";
  }
  else {
    enable = 1;
    iVar1 = setsockopt(__fd,1,2,&enable,4);
    if (iVar1 < 0) {
      __s = "setsockopt(SO_REUSEADDR)";
    }
    else {
      local_20.sa_data[6] = '\0';
      local_20.sa_data[7] = '\0';
      local_20.sa_data[8] = '\0';
      local_20.sa_data[9] = '\0';
      local_20.sa_data[10] = '\0';
      local_20.sa_data[0xb] = '\0';
      local_20.sa_data[0xc] = '\0';
      local_20.sa_data[0xd] = '\0';
      local_20.sa_family = 2;
      local_20.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      local_20.sa_data[2] = '\0';
      local_20.sa_data[3] = '\0';
      local_20.sa_data[4] = '\0';
      local_20.sa_data[5] = '\0';
      iVar1 = bind(__fd,&local_20,0x10);
      if (iVar1 < 0) {
        __s = "bind()";
      }
      else {
        iVar1 = listen(__fd,10);
        if (-1 < iVar1) {
          return __fd;
        }
        __s = "listen()";
      }
    }
  }
  perror(__s);
  exit(1);
}

Assistant:

int setup_listening_socket(int port) {
    int sock;
    struct sockaddr_in srv_addr;

    sock = socket(PF_INET, SOCK_STREAM, 0);
    if (sock == -1)
        handle_error("socket()");

    int enable = 1;
    if (setsockopt(sock,
                   SOL_SOCKET, SO_REUSEADDR,
                   &enable, sizeof(int)) < 0)
        handle_error("setsockopt(SO_REUSEADDR)");


    memset(&srv_addr, 0, sizeof(srv_addr));
    srv_addr.sin_family = AF_INET;
    srv_addr.sin_port = htons(port);
    srv_addr.sin_addr.s_addr = htonl(INADDR_ANY);

    /* We bind to a port and turn this socket into a listening
     * socket.
     * */
    if (bind(sock,
             (const struct sockaddr *)&srv_addr,
             sizeof(srv_addr)) < 0)
        handle_error("bind()");

    if (listen(sock, 10) < 0)
        handle_error("listen()");

    return (sock);
}